

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

ssize_t __thiscall
dap::ContentReader::read_abi_cxx11_(ContentReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  char cVar2;
  undefined4 in_register_00000034;
  ContentReader *this_00;
  ulong local_48;
  size_t i;
  size_t sStack_38;
  char c;
  size_t len;
  allocator<char> local_19;
  ContentReader *local_18;
  ContentReader *this_local;
  string *out;
  
  this_00 = (ContentReader *)CONCAT44(in_register_00000034,__fd);
  local_18 = this_00;
  this_local = this;
  if (this_00->on_invalid_data == kClose) {
    bVar1 = match(this_00,"Content-Length:");
    if (!bVar1) {
      badHeader_abi_cxx11_((string *)this,this_00);
      return (ssize_t)this;
    }
  }
  else {
    bVar1 = scan(this_00,"Content-Length:");
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_19);
      std::allocator<char>::~allocator(&local_19);
      return (ssize_t)this;
    }
  }
  do {
    cVar2 = matchAny(this_00," \t");
  } while (cVar2 != '\0');
  sStack_38 = 0;
  while (i._7_1_ = matchAny(this_00,"0123456789"), i._7_1_ != '\0') {
    sStack_38 = (long)i._7_1_ + -0x30 + sStack_38 * 10;
  }
  if (sStack_38 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,"",(allocator<char> *)((long)&i + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  }
  else {
    bVar1 = match(this_00,"\r\n\r\n");
    if (bVar1) {
      bVar1 = buffer(this_00,sStack_38);
      if (bVar1) {
        i._4_1_ = 0;
        std::__cxx11::string::string((string *)this);
        std::__cxx11::string::reserve((ulong)this);
        for (local_48 = 0; local_48 < sStack_38; local_48 = local_48 + 1) {
          std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front(&this_00->buf);
          std::__cxx11::string::push_back((char)this);
          std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this_00->buf);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)this,"",(allocator<char> *)((long)&i + 5));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i + 5));
      }
    }
    else {
      badHeader_abi_cxx11_((string *)this,this_00);
    }
  }
  return (ssize_t)this;
}

Assistant:

std::string ContentReader::read() {
  // Find Content-Length header prefix
  if (on_invalid_data == kClose) {
    if (!match("Content-Length:")) {
      return badHeader();
    }
  } else {
    if (!scan("Content-Length:")) {
      return "";
    }
  }
  // Skip whitespace and tabs
  while (matchAny(" \t")) {
  }
  // Parse length
  size_t len = 0;
  while (true) {
    auto c = matchAny("0123456789");
    if (c == 0) {
      break;
    }
    len *= 10;
    len += size_t(c) - size_t('0');
  }
  if (len == 0) {
    return "";
  }

  // Expect \r\n\r\n
  if (!match("\r\n\r\n")) {
    return badHeader();
  }

  // Read message
  if (!buffer(len)) {
    return "";
  }
  std::string out;
  out.reserve(len);
  for (size_t i = 0; i < len; i++) {
    out.push_back(static_cast<char>(buf.front()));
    buf.pop_front();
  }
  return out;
}